

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O3

int fill_cmd_string(nt_opts *opts,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  ushort **ppuVar6;
  int iVar7;
  ulong uVar8;
  char *__format;
  char *__s;
  ulong uVar9;
  char *local_50;
  int local_40;
  
  __s = opts->command;
  iVar3 = sprintf(__s,"\n  command: %s",*argv);
  local_50 = opts->command + iVar3;
  if (1 < argc) {
    iVar3 = 0x800 - iVar3;
    uVar9 = 1;
    iVar7 = 0;
    do {
      if (iVar7 == 0) {
        pcVar2 = argv[uVar9];
        sVar5 = strlen(pcVar2);
        iVar7 = (int)sVar5;
        if (iVar3 <= iVar7 + 3) {
          fill_cmd_string_cold_1();
          return 1;
        }
        if (1 < iVar7) {
          ppuVar6 = __ctype_b_loc();
          uVar8 = 0;
          do {
            if ((*(byte *)((long)*ppuVar6 + (long)pcVar2[uVar8] * 2 + 1) & 0x20) != 0) {
              __format = " \'%s\'";
              goto LAB_0010b588;
            }
            uVar8 = uVar8 + 1;
          } while (iVar7 - 1 != uVar8);
        }
        __format = " %s";
LAB_0010b588:
        iVar4 = sprintf(local_50,__format,pcVar2);
        pcVar2 = argv[uVar9 - 1];
        iVar7 = 0;
        if ((((*pcVar2 == '-') && (pcVar2[1] == 'i')) && (pcVar2[2] == 'n')) &&
           (iVar1 = (opts->infiles).len, iVar7 = iVar1 + -2, iVar1 < 5)) {
          iVar7 = 0;
        }
        iVar3 = iVar3 - iVar4;
        local_50 = local_50 + iVar4;
      }
      else {
        iVar7 = iVar7 + -1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uint)argc);
  }
  if (1 < g_debug) {
    local_40 = (int)__s;
    fprintf(_stderr,"+d filled command string, %d args, %d bytes\n",(ulong)(uint)argc,
            (ulong)(uint)((int)local_50 - local_40));
    if (2 < g_debug) {
      fprintf(_stderr,"%s\n",__s);
    }
  }
  return 0;
}

Assistant:

int fill_cmd_string( nt_opts * opts, int argc, char * argv[])
{
   char * cp;
   int    len, remain = NT_CMD_LEN;  /* NT_CMD_LEN is max command len */
   int    c, ac;
   int    has_space;  /* arguments containing space must be quoted */
   int    skip = 0;   /* counter to skip some of the arguments     */

   /* get the first argument separately */
   len = sprintf( opts->command, "\n  command: %s", argv[0] );
   cp = opts->command + len;
   remain -= len;

   /* get the rest, with special attention to input files */
   for( ac = 1; ac < argc; ac++ )
   {
      if( skip ){ skip--;  continue; }  /* then skip these arguments */

      len = strlen(argv[ac]);
      if( len + 3 >= remain ) {  /* extra 3 for space and possible '' */
         fprintf(stderr,"FCS: no space remaining for command, continuing...\n");
         return 1;
      }

      /* put the argument in, possibly with '' */

      has_space = 0;
      for( c = 0; c < len-1; c++ )
         if( isspace(argv[ac][c]) ){ has_space = 1; break; }
      if( has_space ) len = sprintf(cp, " '%s'", argv[ac]);
      else            len = sprintf(cp, " %s",   argv[ac]);

      remain -= len;

      /* infiles is okay, but after the *next* argument, we may skip files */
      /* (danger, will robinson!  hack alert!) */
      if( !strncmp(argv[ac-1],"-infiles",3) )
      {
         /* if more than 4 (just to be arbitrary) input files,
            include only the first and last */
         if( opts->infiles.len > 4 )
            skip = opts->infiles.len - 2;
      }

      cp += len;
   }

   if( g_debug > 1 ){
      fprintf(stderr,"+d filled command string, %d args, %d bytes\n",
              argc, (int)(cp - opts->command));
      if( g_debug > 2 ) fprintf(stderr,"%s\n", opts->command);
   }

   return 0;
}